

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person.hpp
# Opt level: O2

void __thiscall Person::~Person(Person *this)

{
  std::__cxx11::string::~string((string *)&this->position);
  std::__cxx11::string::~string((string *)&this->company_name);
  std::__cxx11::string::~string((string *)&this->city);
  std::__cxx11::string::~string((string *)&this->post_code);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Person() = default;